

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O2

void add_reset_args(Item *q)

{
  add_reset_args::reset_fun_cnt = add_reset_args::reset_fun_cnt + 1;
  sprintf(buf,"&_reset, &_freset%d,");
  insertstr(q->next,buf);
  sprintf(buf,"static double _freset%d;\n",(ulong)(uint)add_reset_args::reset_fun_cnt);
  lappendstr(firstlist,buf);
  return;
}

Assistant:

void add_reset_args(q)
	Item *q;
{
	static int reset_fun_cnt=0;
	
	reset_fun_cnt++;
	Sprintf(buf, "&_reset, &_freset%d,", reset_fun_cnt);
	Insertstr(q->next, buf);
	Sprintf(buf, "static double _freset%d;\n", reset_fun_cnt);
	Lappendstr(firstlist, buf);
}